

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall ktx::ValidationContext::validatePaddings(ValidationContext *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_long __val;
  pointer pkVar7;
  pointer pkVar8;
  anon_class_16_2_1291d6ae check;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  size_t position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = (this->header).dataFormatDescriptor.byteOffset;
  uVar2 = (this->header).dataFormatDescriptor.byteLength;
  uVar3 = (this->header).keyValueData.byteOffset;
  uVar4 = (this->header).keyValueData.byteLength;
  sVar5 = (this->header).supercompressionGlobalData.byteOffset;
  sVar6 = (this->header).supercompressionGlobalData.byteLength;
  position = (ulong)this->numLevels * 0x18 + 0x50;
  check.position = &position;
  check.this = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"DFD",(allocator<char> *)&local_d8);
  validatePaddings::anon_class_16_2_1291d6ae::operator()(&check,(ulong)uVar1,(ulong)uVar2,&local_78)
  ;
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"KVD",(allocator<char> *)&local_d8);
  validatePaddings::anon_class_16_2_1291d6ae::operator()(&check,(ulong)uVar3,(ulong)uVar4,&local_98)
  ;
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"SGD",(allocator<char> *)&local_d8);
  validatePaddings::anon_class_16_2_1291d6ae::operator()(&check,sVar5,sVar6,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  pkVar7 = (this->levelIndices).
           super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  pkVar8 = (this->levelIndices).
           super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __val = ((long)pkVar8 - (long)pkVar7) / 0x18;
  for (; __val = __val - 1, pkVar8 != pkVar7; pkVar8 = pkVar8 + -1) {
    sVar5 = pkVar8[-1].byteOffset;
    sVar6 = pkVar8[-1].byteLength;
    std::__cxx11::to_string(&local_d8,__val);
    std::operator+(&local_50,"image level ",&local_d8);
    validatePaddings::anon_class_16_2_1291d6ae::operator()(&check,sVar5,sVar6,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d8);
    pkVar7 = (this->levelIndices).
             super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

void ValidationContext::validatePaddings() {
    const auto levelIndexOffset = sizeof(KTX_header2);
    const auto levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    const auto dfdByteOffset = header.dataFormatDescriptor.byteOffset;
    const auto dfdByteLength = header.dataFormatDescriptor.byteLength;
    const auto kvdByteOffset = header.keyValueData.byteOffset;
    const auto kvdByteLength = header.keyValueData.byteLength;
    const auto sgdByteOffset = header.supercompressionGlobalData.byteOffset;
    const auto sgdByteLength = header.supercompressionGlobalData.byteLength;

    size_t position = levelIndexOffset + levelIndexSize;
    const auto check = [&](size_t offset, size_t size, std::string name) {
        if (offset == 0 || size == 0)
            return; // Block is missing, skip

        if (offset < position) {
            position = std::max(position, offset + size);
            return; // Just ignore invalid block placements regarding padding checks
        }

        const auto paddingSize = offset - position;
        const auto buffer = std::make_unique<uint8_t[]>(paddingSize);
        read(position, buffer.get(), paddingSize, "the padding before " + name);

        for (size_t i = 0; i < paddingSize; ++i)
            if (buffer[i] != 0) {
                error(Metadata::PaddingNotZero, buffer[i], fmt::format("before {} at offset {}", name, position + i));
                break; // Only report the first non-zero byte per padding, no need to spam
            }

        position = offset + size;
    };

    check(dfdByteOffset, dfdByteLength, "DFD");
    check(kvdByteOffset, kvdByteLength, "KVD");
    check(sgdByteOffset, sgdByteLength, "SGD");
    size_t i = levelIndices.size() - 1;
    for (auto it = levelIndices.rbegin(); it != levelIndices.rend(); ++it)
        check(it->byteOffset, it->byteLength, "image level " + std::to_string(i--));
}